

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateMemberConstexprConstructor
          (SingularString *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    io::Printer::Emit(p,0x17,"$name$_(nullptr, false)");
    return;
  }
  io::Printer::Emit(p,0x53,
                    "$name$_(\n    &$pbi$::fixed_address_empty_string,\n    ::_pbi::ConstantInitialized())"
                   );
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (is_inlined()) {
      p->Emit("$name$_(nullptr, false)");
    } else {
      p->Emit(
          "$name$_(\n"
          "    &$pbi$::fixed_address_empty_string,\n"
          "    ::_pbi::ConstantInitialized())");
    }
  }